

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestSuite *pTVar1;
  TestInfo *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  UnitTestImpl *pUVar4;
  int iVar5;
  pointer ppTVar6;
  FILE *__stream;
  pointer ppTVar7;
  bool bVar8;
  pointer ppTVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  stringstream stream;
  undefined1 local_230 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  long *local_208 [2];
  long local_1f8 [2];
  UnitTestImpl *local_1e8;
  pointer local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  ppTVar9 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1e0 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_1e8 = this;
  if (ppTVar9 != local_1e0) {
    do {
      pTVar1 = *ppTVar9;
      ppTVar6 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar7 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar7 != ppTVar6) {
        bVar8 = false;
        uVar11 = 0;
        do {
          pTVar2 = ppTVar6[uVar11];
          if (pTVar2->matches_filter_ == true) {
            if (!bVar8) {
              printf("%s.",(pTVar1->name_)._M_dataplus._M_p);
              pbVar3 = (pTVar1->type_param_)._M_t.
                       super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
                iVar5 = 0x13b822;
                printf("  # %s = ");
                pbVar3 = (pTVar1->type_param_)._M_t.
                         super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
                if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                  _Var10._M_p = (char *)0x0;
                }
                else {
                  _Var10._M_p = (pbVar3->_M_dataplus)._M_p;
                }
                PrintOnOneLine(_Var10._M_p,iVar5);
              }
              putchar(10);
            }
            printf("  %s",(pTVar2->name_)._M_dataplus._M_p);
            pbVar3 = (pTVar2->value_param_)._M_t.
                     super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
               && ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
              iVar5 = 0x13b888;
              printf("  # %s = ");
              pbVar3 = (pTVar2->value_param_)._M_t.
                       super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                _Var10._M_p = (char *)0x0;
              }
              else {
                _Var10._M_p = (pbVar3->_M_dataplus)._M_p;
              }
              PrintOnOneLine(_Var10._M_p,iVar5);
            }
            putchar(10);
            ppTVar6 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppTVar7 = (pTVar1->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar8 = true;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)ppTVar7 - (long)ppTVar6 >> 3));
      }
      ppTVar9 = ppTVar9 + 1;
    } while (ppTVar9 != local_1e0);
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)local_1d8);
  if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 != 0))
  goto LAB_0012d2f6;
  UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,(char *)local_230._0_8_,(allocator<char> *)local_208);
  __stream = (FILE *)OpenFileForWriting((string *)local_1b8);
  pUVar4 = local_1e8;
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  iVar5 = std::__cxx11::string::compare((char *)local_1d8);
  if (iVar5 == 0) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
              ((XmlUnitTestResultPrinter *)local_230,(char *)local_208[0]);
    XmlUnitTestResultPrinter::PrintXmlTestsList((ostream *)(local_1b8 + 0x10),&pUVar4->test_suites_)
    ;
    local_230._0_8_ = &PTR__XmlUnitTestResultPrinter_00151f98;
LAB_0012d25d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._8_8_ != &local_218) {
      operator_delete((void *)local_230._8_8_,local_218._M_allocated_capacity + 1);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)local_1d8);
    if (iVar5 == 0) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                ((JsonUnitTestResultPrinter *)local_230,(char *)local_208[0]);
      JsonUnitTestResultPrinter::PrintJsonTestList
                ((ostream *)(local_1b8 + 0x10),&pUVar4->test_suites_);
      local_230._0_8_ = &PTR__JsonUnitTestResultPrinter_00152038;
      goto LAB_0012d25d;
    }
  }
  StringStreamToString((string *)local_230,(stringstream *)local_1b8);
  fputs((char *)local_230._0_8_,__stream);
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_0012d2f6:
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::SetTestPartResultReporterForCurrentThread(
    TestPartResultReporterInterface* reporter) {
  per_thread_test_part_result_reporter_.set(reporter);
}